

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O1

void __thiscall
cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *targetName)

{
  _Base_ptr p_Var1;
  cmGeneratorTarget *pcVar2;
  _Base_ptr p_Var3;
  _Rb_tree_header *p_Var4;
  
  p_Var4 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var1 = &p_Var4->_M_header;
  for (; p_Var3 != (_Base_ptr)0x0;
      p_Var3 = (&p_Var3->_M_left)[*(cmLocalGenerator **)(p_Var3 + 1) < localGen]) {
    if (*(cmLocalGenerator **)(p_Var3 + 1) >= localGen) {
      p_Var1 = p_Var3;
    }
  }
  p_Var3 = &p_Var4->_M_header;
  if (((_Rb_tree_header *)p_Var1 != p_Var4) &&
     (p_Var3 = p_Var1, localGen < *(cmLocalGenerator **)(p_Var1 + 1))) {
    p_Var3 = &p_Var4->_M_header;
  }
  if (((_Rb_tree_header *)p_Var3 != p_Var4) &&
     (pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse(localGen,(string *)&p_Var3[1]._M_parent),
     pcVar2 != (cmGeneratorTarget *)0x0)) {
    cmTarget::AddUtility(pcVar2->Target,targetName,false,localGen->Makefile);
    return;
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen(
  cmLocalGenerator* localGen, std::string const& targetName)
{
  auto const it = this->GlobalAutoGenTargets_.find(localGen);
  if (it != this->GlobalAutoGenTargets_.end()) {
    cmGeneratorTarget const* target =
      localGen->FindGeneratorTargetToUse(it->second);
    if (target != nullptr) {
      target->Target->AddUtility(targetName, false, localGen->GetMakefile());
    }
  }
}